

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O3

int ON_ArePointsOnLine(int dim,bool is_rat,int count,int stride,double *point,ON_BoundingBox *bbox,
                      ON_Line *line,double tolerance)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ON_3dPoint *pOVar6;
  undefined8 uVar7;
  char *sFormat;
  bool bVar8;
  double *pdVar9;
  undefined7 in_register_00000031;
  double dVar10;
  double t;
  ON_3dPoint Q;
  double local_a0;
  int local_94;
  double local_90;
  uint local_88;
  uint local_84;
  undefined4 local_80;
  undefined4 local_7c;
  ON_3dPoint local_78;
  double *local_58;
  ulong local_50;
  ON_3dVector local_48;
  
  if (0 < count) {
    local_88 = (uint)CONCAT71(in_register_00000031,is_rat);
    bVar3 = ON_Line::IsValid(line);
    if (bVar3) {
      bVar3 = ON_BoundingBox::IsValid(bbox);
      if (bVar3) {
        bVar3 = ON_IsValid(tolerance);
        if (tolerance < 0.0 || !bVar3) {
          sFormat = "tolerance parameter not valid";
          iVar4 = 0xfa;
        }
        else if (dim - 4U < 0xfffffffe) {
          sFormat = "dim parameter not valid";
          iVar4 = 0xff;
        }
        else if (point == (double *)0x0) {
          sFormat = "point parameter not valid";
          iVar4 = 0x104;
        }
        else if (stride < (int)((local_88 & 0xff) + dim)) {
          sFormat = "stride parameter not valid";
          iVar4 = 0x109;
        }
        else {
          local_a0 = tolerance;
          if ((tolerance == 0.0) && (!NAN(tolerance))) {
            local_a0 = ON_BoundingBox::Tolerance(bbox);
          }
          local_78.z = ON_3dPoint::Origin.z;
          local_78.x = ON_3dPoint::Origin.x;
          local_78.y = ON_3dPoint::Origin.y;
          uVar5 = 2;
          local_84 = stride;
          local_58 = point;
          local_50 = (ulong)(uint)dim;
          if (count != 1) {
            ON_BoundingBox::Diagonal(&local_48,bbox);
            dVar10 = ON_3dVector::Length(&local_48);
            uVar5 = (ulong)(2 - (local_a0 < dVar10));
          }
          iVar4 = 0;
          uVar7 = CONCAT71((int7)(uVar5 >> 8),1);
          do {
            local_80 = (undefined4)uVar7;
            pOVar6 = ON_BoundingBox::operator[](bbox,iVar4);
            local_78.x = pOVar6->x;
            uVar7 = CONCAT71((int7)((ulong)pOVar6 >> 8),1);
            iVar4 = 0;
            do {
              local_7c = (undefined4)uVar7;
              pOVar6 = ON_BoundingBox::operator[](bbox,iVar4);
              local_78.y = pOVar6->y;
              iVar4 = 0;
              bVar3 = true;
              do {
                bVar8 = bVar3;
                pOVar6 = ON_BoundingBox::operator[](bbox,iVar4);
                local_78.z = pOVar6->z;
                ON_Line::ClosestPointTo(line,&local_78,&local_90);
                ON_Line::PointAt((ON_3dPoint *)&local_48,line,local_90);
                dVar10 = ON_3dPoint::DistanceTo(&local_78,(ON_3dPoint *)&local_48);
                uVar2 = local_50;
                uVar1 = local_84;
                if (local_a0 < dVar10) break;
                iVar4 = 1;
                bVar3 = false;
              } while (bVar8);
              iVar4 = 1;
              uVar7 = 0;
            } while (((byte)local_7c & dVar10 <= local_a0) != 0);
            uVar7 = 0;
          } while (((byte)local_80 & dVar10 <= local_a0) != 0);
          if (dVar10 <= local_a0) {
            return (int)uVar5;
          }
          local_78.z = ON_3dPoint::Origin.z;
          local_78.x = ON_3dPoint::Origin.x;
          local_78.y = ON_3dPoint::Origin.y;
          iVar4 = 2;
          if (count != 1) {
            ON_BoundingBox::Diagonal(&local_48,bbox);
            dVar10 = ON_3dVector::Length(&local_48);
            iVar4 = 2 - (uint)(local_a0 < dVar10);
          }
          local_94 = count;
          if ((char)local_88 == '\0') {
            pdVar9 = local_58;
            do {
              memcpy(&local_78,pdVar9,(ulong)(uint)((int)uVar2 << 3));
              ON_Line::ClosestPointTo(line,&local_78,&local_90);
              ON_Line::PointAt((ON_3dPoint *)&local_48,line,local_90);
              dVar10 = ON_3dPoint::DistanceTo(&local_78,(ON_3dPoint *)&local_48);
              if (local_a0 < dVar10) {
                return 0;
              }
              pdVar9 = pdVar9 + uVar1;
              local_94 = local_94 + -1;
            } while (local_94 != 0);
            return iVar4;
          }
          pdVar9 = local_58;
          while( true ) {
            dVar10 = pdVar9[uVar2 & 0xffffffff];
            if ((dVar10 == 0.0) && (!NAN(dVar10))) break;
            ON_ArrayScale((int)local_50,1.0 / dVar10,pdVar9,&local_78.x);
            ON_Line::ClosestPointTo(line,&local_78,&local_90);
            ON_Line::PointAt((ON_3dPoint *)&local_48,line,local_90);
            dVar10 = ON_3dPoint::DistanceTo(&local_78,(ON_3dPoint *)&local_48);
            if (local_a0 < dVar10) {
              return 0;
            }
            pdVar9 = pdVar9 + uVar1;
            local_94 = local_94 + -1;
            if (local_94 == 0) {
              return iVar4;
            }
          }
          sFormat = "rational point has zero weight";
          iVar4 = 299;
        }
      }
      else {
        sFormat = "bbox parameter not valid";
        iVar4 = 0xf5;
      }
    }
    else {
      sFormat = "line parameter not valid";
      iVar4 = 0xf0;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_line.cpp"
               ,iVar4,"",sFormat);
  }
  return 0;
}

Assistant:

int ON_ArePointsOnLine( // returns 0=no, 1 = yes, 2 = pointset is (to tolerance) a single point on the line
        int dim,     // 2 or 3
        bool is_rat,
        int count, 
        int stride, const double* point,
        const ON_BoundingBox& bbox, // if needed, use ON_GetBoundingBox(dim,is_rat,count,stride,point)
        const ON_Line& line,  // line to test
        double tolerance
        )
{
  double w;
  int i, j, k;

  if ( count < 1 )
    return 0;

  if ( !line.IsValid() )
  {
    ON_ERROR("line parameter not valid");
    return 0;
  }
  if ( !bbox.IsValid() )
  {
    ON_ERROR("bbox parameter not valid");
    return 0;
  }
  if ( !ON_IsValid(tolerance) || tolerance < 0.0 )
  {
    ON_ERROR("tolerance parameter not valid");
    return 0;
  }
  if ( dim < 2 || dim > 3 )
  {
    ON_ERROR("dim parameter not valid");
    return 0;
  }
  if ( 0 == point )
  {
    ON_ERROR("point parameter not valid");
    return 0;
  }
  if ( stride < (is_rat?(dim+1):dim) )
  {
    ON_ERROR("stride parameter not valid");
    return 0;
  }

  int rc = 0;

  if ( tolerance == 0.0 ) {
    tolerance = bbox.Tolerance();
  }

  ON_3dPoint Q(ON_3dPoint::Origin);

  // test bounding box to quickly detect the common coordinate axis cases
  rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
  for ( i = 0; rc && i < 2; i++ ) {
    Q.x = bbox[i].x;
    for ( j = 0; rc && j < 2; j++) {
      Q.y = bbox[j].y;
      for ( k = 0; rc && k < 2; k++) {
        Q.z = bbox[k].z;
        if ( Q.DistanceTo( line.ClosestPointTo( Q ) ) > tolerance )
          rc = 0;
      }
    }
  }

  if ( !rc ) {
    // test points one by one
    Q = ON_3dPoint::Origin;
    rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
    if ( is_rat ) {
      for ( i = 0; i < count; i++ ) {
        w = point[dim];
        if ( w == 0.0 ) {
          ON_ERROR("rational point has zero weight");
          return 0;
        }
        ON_ArrayScale( dim, 1.0/w, point, &Q.x );
        if ( Q.DistanceTo( line.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
    else {
      for ( i = 0; i < count; i++ ) {
        memcpy( &Q.x, point, dim*sizeof(Q.x) );
        if ( Q.DistanceTo( line.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
  }

  return rc;
}